

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_nested_loop_join.cpp
# Opt level: O2

void __thiscall
duckdb::NestedLoopJoinLocalScanState::NestedLoopJoinLocalScanState
          (NestedLoopJoinLocalScanState *this,PhysicalNestedLoopJoin *op,
          NestedLoopJoinGlobalScanState *gstate)

{
  OuterJoinMarker *this_00;
  
  (this->super_LocalSourceState)._vptr_LocalSourceState =
       (_func_int **)&PTR__NestedLoopJoinLocalScanState_027bad00;
  OuterJoinLocalScanState::OuterJoinLocalScanState(&this->scan_state);
  this_00 = (OuterJoinMarker *)
            &(op->super_PhysicalComparisonJoin).super_PhysicalJoin.super_CachingPhysicalOperator.
             super_PhysicalOperator.sink_state;
  unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
  operator->((unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
              *)this_00);
  OuterJoinMarker::InitializeScan(this_00,&gstate->scan_state,&this->scan_state);
  return;
}

Assistant:

explicit NestedLoopJoinLocalScanState(const PhysicalNestedLoopJoin &op, NestedLoopJoinGlobalScanState &gstate) {
		D_ASSERT(op.sink_state);
		auto &sink = op.sink_state->Cast<NestedLoopJoinGlobalState>();
		sink.right_outer.InitializeScan(gstate.scan_state, scan_state);
	}